

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  char cVar5;
  
  cVar1 = *first;
  if (cVar1 != '\0') {
    pcVar3 = first + 1;
    do {
      cVar2 = *second;
      if ((cVar2 == '\0') || (max == 0)) break;
      cVar5 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar5 = cVar1;
      }
      cVar4 = cVar2 + -0x20;
      if (0x19 < (byte)(cVar2 + 0x9fU)) {
        cVar4 = cVar2;
      }
      if (cVar5 != cVar4) {
        max = 1;
        break;
      }
      max = max - 1;
      second = second + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  if (max == 0) {
    return 1;
  }
  cVar2 = cVar1 + -0x20;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    cVar2 = cVar1;
  }
  cVar1 = *second;
  cVar5 = cVar1 + -0x20;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    cVar5 = cVar1;
  }
  return (int)(cVar2 == cVar5);
}

Assistant:

int strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(raw_toupper(*first) != raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return raw_toupper(*first) == raw_toupper(*second);
}